

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O2

BoxArray * __thiscall amrex::AmrLevel::getNodalBoxArray(AmrLevel *this)

{
  BoxArray *this_00;
  element_type *peVar1;
  
  this_00 = &this->nodal_grids;
  peVar1 = (this->nodal_grids).m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if ((peVar1->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      *(pointer *)
       ((long)&(peVar1->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data + 8)) {
    BoxArray::operator=(this_00,&this->grids);
    BoxArray::surroundingNodes(this_00);
  }
  return this_00;
}

Assistant:

const BoxArray&
AmrLevel::getNodalBoxArray () const noexcept
{
    if (nodal_grids.empty()) {
        nodal_grids = grids;
        nodal_grids.surroundingNodes();
    }
    return nodal_grids;
}